

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O1

void __thiscall GPIO::GPIOBase::SoftThread::run_pwm(SoftThread *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  timespec local_40;
  
  do {
    uVar1 = (this->m_mark).super___atomic_base<unsigned_int>._M_i;
    uVar4 = (ulong)uVar1;
    uVar2 = (this->m_space).super___atomic_base<unsigned_int>._M_i;
    uVar6 = (ulong)uVar2;
    if (uVar2 == 0 && uVar1 == 0) {
      return;
    }
    if (uVar4 != 0) {
      gpio_addr[(ulong)(this->m_gpio >> 5) + 7] = (long)(1 << ((byte)this->m_gpio & 0x1f));
      local_40.tv_sec = uVar4 / 10000;
      local_40.tv_nsec = local_40.tv_sec * -1000000000 + uVar4 * 100000;
      do {
        iVar3 = nanosleep(&local_40,&local_40);
        if (iVar3 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    }
    if (uVar6 != 0) {
      gpio_addr[(ulong)(this->m_gpio >> 5) + 10] = (long)(1 << ((byte)this->m_gpio & 0x1f));
      local_40.tv_sec = uVar6 / 10000;
      local_40.tv_nsec = local_40.tv_sec * -1000000000 + uVar6 * 100000;
      do {
        iVar3 = nanosleep(&local_40,&local_40);
        if (iVar3 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    }
    if (uVar2 == 0 && uVar1 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void GPIOBase::SoftThread::run_pwm()
{
    static const std::chrono::microseconds base_period = std::chrono::microseconds(100);
    
    for (;;) {
        unsigned int local_mark = m_mark;
        unsigned int local_space = m_space;

        // terminate?

        if (local_mark == 0 && local_space == 0) return;
        if (local_mark != 0) {
            int_set(m_gpio);
            std::this_thread::sleep_for(base_period * local_mark);
        }
        if (local_space != 0) {
            int_clear(m_gpio);
            std::this_thread::sleep_for(base_period * local_space);
        }
    }
}